

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::IndexOfHelper<true>(Arguments *args,ScriptContext *scriptContext)

{
  code *pcVar1;
  unsigned_long fromIndex_00;
  uint uVar2;
  JavascriptArray *pJVar3;
  bool bVar4;
  BOOL BVar5;
  int iVar6;
  TypeId TVar7;
  uint32 uVar8;
  ThreadContext *threadContext;
  Var pvVar9;
  JavascriptLibrary *pJVar10;
  uint64 uVar11;
  undefined4 *puVar12;
  JavascriptNativeIntArray *pArr_00;
  JavascriptNativeFloatArray *pArr_01;
  TypedArrayBase *local_178;
  Arguments *local_120;
  uint local_10c;
  uint local_e8;
  TypedArrayBase *typedArrayObj;
  int32 index;
  uint32 len_1;
  BOOL gotParam_2;
  BOOL gotParam_1;
  BOOL gotParam;
  uint32 len;
  uint64 fromIndex64;
  Var pvStack_90;
  uint32 fromIndex;
  Var search;
  Var falseValue;
  Var trueValue;
  BigIndex length;
  JavascriptArray *pArr;
  RecyclableObject *obj;
  undefined1 local_48 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  Arguments *args_local;
  
  jsReentLock._24_8_ = scriptContext;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_48,threadContext);
  pvVar9 = Arguments::operator[](args,0);
  JsReentLock::setObjectForMutation((JsReentLock *)local_48,pvVar9);
  pArr = (JavascriptArray *)0x0;
  length.bigIndex = 0;
  BigIndex::BigIndex((BigIndex *)&trueValue,0);
  pJVar10 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
  falseValue = JavascriptLibraryBase::GetTrue(&pJVar10->super_JavascriptLibraryBase);
  pJVar10 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
  search = JavascriptLibraryBase::GetFalse(&pJVar10->super_JavascriptLibraryBase);
  JsReentLock::unlock((JsReentLock *)local_48);
  pvVar9 = Arguments::operator[](args,0);
  TryGetArrayAndLength<Js::JavascriptArray::BigIndex>
            (pvVar9,(ScriptContext *)jsReentLock._24_8_,L"Array.prototype.indexOf",
             (JavascriptArray **)&length.bigIndex,(RecyclableObject **)&pArr,(BigIndex *)&trueValue)
  ;
  JsReentLock::MutateArrayObject((JsReentLock *)local_48);
  JsReentLock::relock((JsReentLock *)local_48);
  fromIndex64._4_4_ = 0;
  _gotParam = 0;
  if (((length.bigIndex == 0) &&
      (bVar4 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)pArr), !bVar4)) ||
     ((bVar4 = BigIndex::IsSmallIndex((BigIndex *)&trueValue), !bVar4 &&
      (bVar4 = BigIndex::IsUint32Max((BigIndex *)&trueValue), !bVar4)))) {
    bVar4 = BigIndex::IsSmallIndex((BigIndex *)&trueValue);
    if (bVar4) {
      JsReentLock::unlock((JsReentLock *)local_48);
      uVar8 = BigIndex::GetSmallIndex((BigIndex *)&trueValue);
      BVar5 = GetParamForIndexOf<unsigned_int>
                        (uVar8,args,&stack0xffffffffffffff70,(uint *)((long)&fromIndex64 + 4),
                         (ScriptContext *)jsReentLock._24_8_);
      JsReentLock::MutateArrayObject((JsReentLock *)local_48);
      JsReentLock::relock((JsReentLock *)local_48);
      if (BVar5 == 0) {
        args_local = (Arguments *)search;
        goto LAB_010eeaff;
      }
    }
    else {
      JsReentLock::unlock((JsReentLock *)local_48);
      uVar11 = BigIndex::GetBigIndex((BigIndex *)&trueValue);
      BVar5 = GetParamForIndexOf<unsigned_long>
                        (uVar11,args,&stack0xffffffffffffff70,(unsigned_long *)&gotParam,
                         (ScriptContext *)jsReentLock._24_8_);
      JsReentLock::MutateArrayObject((JsReentLock *)local_48);
      JsReentLock::relock((JsReentLock *)local_48);
      if (BVar5 == 0) {
        args_local = (Arguments *)search;
        goto LAB_010eeaff;
      }
    }
  }
  else {
    bVar4 = BigIndex::IsUint32Max((BigIndex *)&trueValue);
    if (bVar4) {
      local_e8 = 0xffffffff;
    }
    else {
      local_e8 = BigIndex::GetSmallIndex((BigIndex *)&trueValue);
    }
    JsReentLock::unlock((JsReentLock *)local_48);
    BVar5 = GetParamForIndexOf<unsigned_int>
                      (local_e8,args,&stack0xffffffffffffff70,(uint *)((long)&fromIndex64 + 4),
                       (ScriptContext *)jsReentLock._24_8_);
    JsReentLock::MutateArrayObject((JsReentLock *)local_48);
    JsReentLock::relock((JsReentLock *)local_48);
    if (BVar5 == 0) {
      args_local = (Arguments *)search;
      goto LAB_010eeaff;
    }
  }
  if ((length.bigIndex != 0) && (bVar4 = IsNonES5Array(pArr), !bVar4)) {
    bVar4 = VarIs<Js::ES5Array,Js::RecyclableObject>((RecyclableObject *)pArr);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0xf86,"(VarIs<ES5Array>(obj))",
                                  "The array should have been converted to an ES5Array");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 0;
    }
    length.bigIndex = 0;
  }
  if ((length.bigIndex == 0) ||
     ((bVar4 = BigIndex::IsSmallIndex((BigIndex *)&trueValue), !bVar4 &&
      (bVar4 = BigIndex::IsUint32Max((BigIndex *)&trueValue), !bVar4)))) {
    pJVar3 = pArr;
    bVar4 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)pArr);
    if (bVar4) {
      local_178 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)pJVar3);
    }
    else {
      local_178 = (TypedArrayBase *)0x0;
    }
    if ((local_178 == (TypedArrayBase *)0x0) ||
       ((bVar4 = BigIndex::IsSmallIndex((BigIndex *)&trueValue), !bVar4 &&
        (bVar4 = BigIndex::IsUint32Max((BigIndex *)&trueValue), !bVar4)))) {
      bVar4 = BigIndex::IsSmallIndex((BigIndex *)&trueValue);
      if (bVar4) {
        JsReentLock::unlock((JsReentLock *)local_48);
        pJVar3 = pArr;
        uVar2 = fromIndex64._4_4_;
        uVar8 = BigIndex::GetSmallIndex((BigIndex *)&trueValue);
        args_local = (Arguments *)
                     TemplatedIndexOfHelper<true,Js::RecyclableObject,unsigned_int>
                               ((RecyclableObject *)pJVar3,pvStack_90,uVar2,uVar8,
                                (ScriptContext *)jsReentLock._24_8_);
      }
      else {
        JsReentLock::unlock((JsReentLock *)local_48);
        pJVar3 = pArr;
        fromIndex_00 = _gotParam;
        uVar11 = BigIndex::GetBigIndex((BigIndex *)&trueValue);
        args_local = (Arguments *)
                     TemplatedIndexOfHelper<true,Js::RecyclableObject,unsigned_long>
                               ((RecyclableObject *)pJVar3,pvStack_90,fromIndex_00,uVar11,
                                (ScriptContext *)jsReentLock._24_8_);
      }
    }
    else {
      JsReentLock::unlock((JsReentLock *)local_48);
      uVar2 = fromIndex64._4_4_;
      uVar8 = BigIndex::GetSmallIndex((BigIndex *)&trueValue);
      args_local = (Arguments *)
                   TemplatedIndexOfHelper<true,Js::TypedArrayBase,unsigned_int>
                             (local_178,pvStack_90,uVar2,uVar8,(ScriptContext *)jsReentLock._24_8_);
    }
  }
  else {
    bVar4 = BigIndex::IsUint32Max((BigIndex *)&trueValue);
    if (bVar4) {
      local_10c = 0xffffffff;
    }
    else {
      local_10c = BigIndex::GetSmallIndex((BigIndex *)&trueValue);
    }
    JsReentLock::unlock((JsReentLock *)local_48);
    iVar6 = (**(code **)(*(long *)length.bigIndex + 0x3c0))
                      (length.bigIndex,pvStack_90,(long)&fromIndex64 + 4,local_10c,1,
                       jsReentLock._24_8_);
    JsReentLock::MutateArrayObject((JsReentLock *)local_48);
    JsReentLock::relock((JsReentLock *)local_48);
    if ((iVar6 == -1) && (fromIndex64._4_4_ != 0xffffffff)) {
      TVar7 = RecyclableObject::GetTypeId((RecyclableObject *)length.bigIndex);
      if (TVar7 == TypeIds_Array) {
        JsReentLock::unlock((JsReentLock *)local_48);
        args_local = (Arguments *)
                     TemplatedIndexOfHelper<true,Js::JavascriptArray,unsigned_int>
                               ((JavascriptArray *)length.bigIndex,pvStack_90,fromIndex64._4_4_,
                                local_10c,(ScriptContext *)jsReentLock._24_8_);
      }
      else if (TVar7 == TypeIds_NativeIntArray) {
        JsReentLock::unlock((JsReentLock *)local_48);
        pArr_00 = UnsafeVarTo<Js::JavascriptNativeIntArray,Js::JavascriptArray>
                            ((JavascriptArray *)length.bigIndex);
        args_local = (Arguments *)
                     TemplatedIndexOfHelper<true,Js::JavascriptNativeIntArray,unsigned_int>
                               (pArr_00,pvStack_90,fromIndex64._4_4_,local_10c,
                                (ScriptContext *)jsReentLock._24_8_);
      }
      else if (TVar7 == TypeIds_ArrayLast) {
        JsReentLock::unlock((JsReentLock *)local_48);
        pArr_01 = UnsafeVarTo<Js::JavascriptNativeFloatArray,Js::JavascriptArray>
                            ((JavascriptArray *)length.bigIndex);
        args_local = (Arguments *)
                     TemplatedIndexOfHelper<true,Js::JavascriptNativeFloatArray,unsigned_int>
                               (pArr_01,pvStack_90,fromIndex64._4_4_,local_10c,
                                (ScriptContext *)jsReentLock._24_8_);
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0xfab,"(0)","invalid array typeid");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
        JsReentLock::unlock((JsReentLock *)local_48);
        args_local = (Arguments *)
                     TemplatedIndexOfHelper<true,Js::JavascriptArray,unsigned_int>
                               ((JavascriptArray *)length.bigIndex,pvStack_90,fromIndex64._4_4_,
                                local_10c,(ScriptContext *)jsReentLock._24_8_);
      }
    }
    else {
      if (iVar6 == -1) {
        local_120 = (Arguments *)search;
      }
      else {
        local_120 = (Arguments *)falseValue;
      }
      args_local = local_120;
    }
  }
LAB_010eeaff:
  JsReentLock::~JsReentLock((JsReentLock *)local_48);
  return args_local;
}

Assistant:

Var JavascriptArray::IndexOfHelper(Arguments const & args, ScriptContext *scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, args[0]);

        RecyclableObject* obj = nullptr;
        JavascriptArray* pArr = nullptr;
        BigIndex length;
        Var trueValue = scriptContext->GetLibrary()->GetTrue();
        Var falseValue = scriptContext->GetLibrary()->GetFalse();

        JS_REENTRANT(jsReentLock, TryGetArrayAndLength(args[0], scriptContext, _u("Array.prototype.indexOf"), &pArr, &obj, &length));
        Var search;
        uint32 fromIndex = 0;
        uint64 fromIndex64 = 0;

        // The evaluation of method arguments may change the type of the array. Hence, we do that prior to the actual helper method calls.
        // The if clause of the conditional statement below applies to an JavascriptArray or TypedArray instances. The rest of the conditional
        // clauses apply to an ES5Array or other valid Javascript objects.
        if ((pArr || VarIs<TypedArrayBase>(obj)) && (length.IsSmallIndex() || length.IsUint32Max()))
        {
            uint32 len = length.IsUint32Max() ? MaxArrayLength : length.GetSmallIndex();
            JS_REENTRANT(jsReentLock, BOOL gotParam = GetParamForIndexOf(len, args, search, fromIndex, scriptContext));
            if (!gotParam)
            {
                return includesAlgorithm ? falseValue : TaggedInt::ToVarUnchecked(-1);
            }
        }
        else if (length.IsSmallIndex())
        {
            JS_REENTRANT(jsReentLock, BOOL gotParam = GetParamForIndexOf(length.GetSmallIndex(), args, search, fromIndex, scriptContext));
            if (!gotParam)
            {
                return includesAlgorithm ? falseValue : TaggedInt::ToVarUnchecked(-1);
            }
        }
        else
        {
            JS_REENTRANT(jsReentLock, BOOL gotParam = GetParamForIndexOf(length.GetBigIndex(), args, search, fromIndex64, scriptContext));
            if (!gotParam)
            {
                return includesAlgorithm ? falseValue : TaggedInt::ToVarUnchecked(-1);
            }
        }

        // Side effects (such as defining a property in a ToPrimitive call) during evaluation of fromIndex argument may convert the array to an ES5 array.
        if (pArr && !JavascriptArray::IsNonES5Array(obj))
        {
            AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
            pArr = nullptr;
        }

        if (pArr)
        {
            if (length.IsSmallIndex() || length.IsUint32Max())
            {
                uint32 len = length.IsUint32Max() ? MaxArrayLength : length.GetSmallIndex();
                JS_REENTRANT(jsReentLock, int32 index = pArr->HeadSegmentIndexOfHelper(search, fromIndex, len, includesAlgorithm, scriptContext));

                // If we found the search value in the head segment, or if we determined there is no need to search other segments,
                // we stop right here.
                if (index != -1 || fromIndex == -1)
                {
                    if (includesAlgorithm)
                    {
                        //Array.prototype.includes
                        return (index == -1) ? falseValue : trueValue;
                    }
                    else
                    {
                        //Array.prototype.indexOf
                        return JavascriptNumber::ToVar(index, scriptContext);
                    }
                }

                //  If we really must search other segments, let's do it now. We'll have to search the slow way (dealing with holes, etc.).
                switch (pArr->GetTypeId())
                {
                case Js::TypeIds_Array:
                    JS_REENTRANT_UNLOCK(jsReentLock, return TemplatedIndexOfHelper<includesAlgorithm>(pArr, search, fromIndex, len, scriptContext));
                case Js::TypeIds_NativeIntArray:
                    JS_REENTRANT_UNLOCK(jsReentLock, return TemplatedIndexOfHelper<includesAlgorithm>(UnsafeVarTo<JavascriptNativeIntArray>(pArr), search, fromIndex, len, scriptContext));
                case Js::TypeIds_NativeFloatArray:
                    JS_REENTRANT_UNLOCK(jsReentLock, return TemplatedIndexOfHelper<includesAlgorithm>(UnsafeVarTo<JavascriptNativeFloatArray>(pArr), search, fromIndex, len, scriptContext));
                default:
                    AssertMsg(FALSE, "invalid array typeid");
                    JS_REENTRANT_UNLOCK(jsReentLock, return TemplatedIndexOfHelper<includesAlgorithm>(pArr, search, fromIndex, len, scriptContext));
                }
            }
        }

        // source object is not a JavascriptArray but source could be a TypedArray
        TypedArrayBase * typedArrayObj = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(obj);
        if (typedArrayObj)
        {
            if (length.IsSmallIndex() || length.IsUint32Max())
            {
                JS_REENTRANT_UNLOCK(jsReentLock, return TemplatedIndexOfHelper<includesAlgorithm>(typedArrayObj, search, fromIndex, length.GetSmallIndex(), scriptContext));
            }
        }
        if (length.IsSmallIndex())
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return TemplatedIndexOfHelper<includesAlgorithm>(obj, search, fromIndex, length.GetSmallIndex(), scriptContext));
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return TemplatedIndexOfHelper<includesAlgorithm>(obj, search, fromIndex64, length.GetBigIndex(), scriptContext));
        }
    }